

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O2

void __thiscall
Lodtalk::StackInterpreterProxy::sendMessage(StackInterpreterProxy *this,int argumentCount)

{
  StackInterpreter::sendMessage(this->interpreter,argumentCount);
  StackInterpreter::interpret(this->interpreter);
  return;
}

Assistant:

void StackInterpreterProxy::sendMessage(int argumentCount)
{
    interpreter->sendMessage(argumentCount);
    interpreter->interpret();
}